

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RegexMatcher::split
          (RegexMatcher *this,UText *input,UText **dest,int32_t destCapacity,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  int64_t iVar6;
  int64_t limit;
  long lVar7;
  UText *ut;
  UChar *pUVar8;
  UText *pUVar9;
  undefined4 in_register_0000000c;
  uint uVar10;
  int32_t destCapacity_00;
  ulong uVar11;
  UText **ppUVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  UErrorCode lengthStatus;
  UText remainingText;
  long local_130;
  UErrorCode local_104;
  UText **local_100;
  long local_f8;
  ulong local_f0;
  UText **local_e8;
  undefined8 local_e0;
  ulong local_d8;
  ulong local_d0;
  UText local_c8;
  long local_38;
  
  local_e0 = CONCAT44(in_register_0000000c,destCapacity);
  iVar5 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar5 = 0;
    if (destCapacity < 1) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      reset(this,input);
      lVar14 = this->fActiveLimit;
      if (lVar14 != 0) {
        iVar1 = (int)local_e0;
        uVar13 = iVar1 - 1;
        uVar3 = 0;
        if (iVar1 == 1) {
          local_130 = 0;
        }
        else {
          local_f8 = CONCAT44(local_f8._4_4_,this->fPattern->fGroupMap->count);
          local_d0 = (ulong)(iVar1 - 2);
          local_130 = 0;
          local_100 = dest;
          do {
            ppUVar12 = local_100;
            if (U_ZERO_ERROR < this->fDeferredStatus) {
LAB_00166ffb:
              if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit)
                  ) && (this->fInputLength == (long)input->nativeIndexingLimit)) {
                pUVar9 = ppUVar12[(int)uVar3];
                if (pUVar9 == (UText *)0x0) {
                  memset(&local_c8,0,0x90);
                  local_c8.magic = 0x345ad82c;
                  local_c8.sizeOfStruct = 0x90;
                  utext_openUChars_63(&local_c8,input->chunkContents + local_130,
                                      this->fActiveLimit - local_130,status);
                  pUVar9 = utext_clone_63((UText *)0x0,&local_c8,'\x01','\0',status);
                  ppUVar12[(int)uVar3] = pUVar9;
                  utext_close_63(&local_c8);
                }
                else {
                  iVar6 = utext_nativeLength_63(pUVar9);
                  utext_replace_63(pUVar9,0,iVar6,input->chunkContents + local_130,
                                   (int)this->fActiveLimit - (int)local_130,status);
                }
              }
              else {
                local_104 = U_ZERO_ERROR;
                iVar5 = utext_extract_63(input,local_130,this->fActiveLimit,(UChar *)0x0,0,
                                         &local_104);
                local_f8 = (long)iVar5;
                pUVar8 = (UChar *)uprv_malloc_63(local_f8 * 2 + 2);
                if (pUVar8 == (UChar *)0x0) {
LAB_00167106:
                  *status = U_MEMORY_ALLOCATION_ERROR;
                }
                else {
                  utext_extract_63(input,local_130,this->fActiveLimit,pUVar8,iVar5 + 1,status);
                  ppUVar12 = local_100;
                  pUVar9 = local_100[(int)uVar3];
                  if (pUVar9 == (UText *)0x0) {
                    memset(&local_c8,0,0x90);
                    local_c8.magic = 0x345ad82c;
                    local_c8.sizeOfStruct = 0x90;
                    utext_openUChars_63(&local_c8,pUVar8,local_f8,status);
                    pUVar9 = utext_clone_63((UText *)0x0,&local_c8,'\x01','\0',status);
                    ppUVar12[(int)uVar3] = pUVar9;
                    utext_close_63(&local_c8);
                  }
                  else {
                    iVar6 = utext_nativeLength_63(pUVar9);
                    utext_replace_63(pUVar9,0,iVar6,pUVar8,iVar5,status);
                  }
                  uprv_free_63(pUVar8);
                }
              }
              goto LAB_0016723a;
            }
            local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
            UVar2 = find(this,(UErrorCode *)&local_c8);
            if (UVar2 == '\0') goto LAB_00166ffb;
            if (((input->chunkNativeStart != 0) || (this->fInputLength != input->chunkNativeLimit))
               || (this->fInputLength != (long)input->nativeIndexingLimit)) {
              local_104 = U_ZERO_ERROR;
              iVar5 = utext_extract_63(input,local_130,this->fMatchStart,(UChar *)0x0,0,&local_104);
              local_e8 = (UText **)(long)iVar5;
              pUVar8 = (UChar *)uprv_malloc_63((long)local_e8 * 2 + 2);
              if (pUVar8 != (UChar *)0x0) {
                utext_extract_63(input,local_130,this->fMatchStart,pUVar8,iVar5 + 1,status);
                ppUVar12 = local_100;
                pUVar9 = local_100[(int)uVar3];
                if (pUVar9 == (UText *)0x0) {
                  memset(&local_c8,0,0x90);
                  local_c8.magic = 0x345ad82c;
                  local_c8.sizeOfStruct = 0x90;
                  utext_openUChars_63(&local_c8,pUVar8,(int64_t)local_e8,status);
                  pUVar9 = utext_clone_63((UText *)0x0,&local_c8,'\x01','\0',status);
                  ppUVar12[(int)uVar3] = pUVar9;
                  utext_close_63(&local_c8);
                }
                else {
                  iVar6 = utext_nativeLength_63(pUVar9);
                  utext_replace_63(pUVar9,0,iVar6,pUVar8,iVar5,status);
                }
                uprv_free_63(pUVar8);
                goto LAB_00166be5;
              }
              goto LAB_00167106;
            }
            pUVar9 = ppUVar12[(int)uVar3];
            if (pUVar9 == (UText *)0x0) {
              memset(&local_c8,0,0x90);
              local_c8.magic = 0x345ad82c;
              local_c8.sizeOfStruct = 0x90;
              utext_openUChars_63(&local_c8,input->chunkContents + local_130,
                                  this->fMatchStart - local_130,status);
              pUVar9 = utext_clone_63((UText *)0x0,&local_c8,'\x01','\0',status);
              ppUVar12[(int)uVar3] = pUVar9;
              utext_close_63(&local_c8);
            }
            else {
              iVar6 = utext_nativeLength_63(pUVar9);
              utext_replace_63(pUVar9,0,iVar6,input->chunkContents + local_130,
                               (int)this->fMatchStart - (int)local_130,status);
            }
LAB_00166be5:
            local_130 = this->fMatchEnd;
            if ((0 < (int)local_f8) && ((int)uVar3 < (int)local_d0)) {
              local_38 = (long)(int)uVar3;
              local_e8 = ppUVar12 + local_38;
              lVar14 = 1;
              do {
                pUVar9 = this->fInputText;
                ut = local_e8[lVar14];
                iVar5 = (int32_t)lVar14;
                iVar6 = start64(this,iVar5,status);
                limit = end64(this,iVar5,status);
                if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                  if (iVar6 == limit) {
                    if (ut == (UText *)0x0) {
                      ut = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
                    }
                    else {
                      iVar6 = utext_nativeLength_63(ut);
                      utext_replace_63(ut,0,iVar6,(UChar *)0x0,0,status);
                    }
                  }
                  else {
                    uVar4 = utext_extract_63(pUVar9,iVar6,limit,(UChar *)0x0,0,status);
                    if (*status == U_BUFFER_OVERFLOW_ERROR || *status < U_ILLEGAL_ARGUMENT_ERROR) {
                      *status = U_ZERO_ERROR;
                      local_c8._0_8_ = (long)&local_c8 + 0xe;
                      local_c8.providerProperties = 0x28;
                      local_c8.sizeOfStruct = local_c8.sizeOfStruct & 0xffffff00;
                      uVar10 = uVar4 + 1;
                      uVar11 = (ulong)uVar10;
                      local_f0 = (ulong)uVar4;
                      if (0x27 < (int)uVar4) {
                        local_d8 = (ulong)uVar10;
                        pUVar8 = (UChar *)uprv_malloc_63((ulong)(uVar10 * 2));
                        if (pUVar8 == (UChar *)0x0) {
                          *status = U_MEMORY_ALLOCATION_ERROR;
                          uVar11 = local_d8;
                        }
                        else {
                          if ((char)local_c8.sizeOfStruct != '\0') {
                            uprv_free_63((void *)local_c8._0_8_);
                          }
                          local_c8.providerProperties = (int32_t)local_d8;
                          local_c8.sizeOfStruct = CONCAT31(local_c8.sizeOfStruct._1_3_,1);
                          uVar11 = local_d8;
                          local_c8._0_8_ = pUVar8;
                        }
                      }
                      destCapacity_00 = (int32_t)uVar11;
                      utext_extract_63(pUVar9,iVar6,limit,(UChar *)local_c8._0_8_,destCapacity_00,
                                       status);
                      if (ut == (UText *)0x0) {
                        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                          if ((char)local_c8.sizeOfStruct == '\0') {
                            if (-1 < (int)local_f0) {
                              if (local_c8.providerProperties < destCapacity_00) {
                                destCapacity_00 = local_c8.providerProperties;
                              }
                              pUVar8 = (UChar *)uprv_malloc_63((long)destCapacity_00 * 2);
                              if (pUVar8 != (UChar *)0x0) {
                                memcpy(pUVar8,(void *)local_c8._0_8_,(long)destCapacity_00 * 2);
                                local_c8.sizeOfStruct = local_c8.sizeOfStruct & 0xffffff00;
                                goto LAB_00166e63;
                              }
                            }
                          }
                          else {
                            local_c8.providerProperties = 0x28;
                            local_c8.sizeOfStruct = local_c8.sizeOfStruct & 0xffffff00;
                            bVar15 = (UChar *)local_c8._0_8_ != (UChar *)0x0;
                            pUVar8 = (UChar *)local_c8._0_8_;
                            local_c8._0_8_ = (long)&local_c8 + 0xe;
                            if (bVar15) {
LAB_00166e63:
                              local_c8._0_8_ = (long)&local_c8 + 0xe;
                              local_c8.providerProperties = 0x28;
                              ut = utext_openUChars_63((UText *)0x0,pUVar8,(long)(int)local_f0,
                                                       status);
                              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                                *(byte *)&ut->providerProperties =
                                     (byte)ut->providerProperties | 0x20;
                                goto LAB_00166e8f;
                              }
                              uprv_free_63(pUVar8);
                              goto LAB_00166e8c;
                            }
                          }
                          *status = U_MEMORY_ALLOCATION_ERROR;
                        }
LAB_00166e8c:
                        ut = (UText *)0x0;
                      }
                      else {
                        iVar6 = utext_nativeLength_63(ut);
                        utext_replace_63(ut,0,iVar6,(UChar *)local_c8._0_8_,(int32_t)local_f0,status
                                        );
                      }
LAB_00166e8f:
                      MaybeStackArray<char16_t,_40>::~MaybeStackArray
                                ((MaybeStackArray<char16_t,_40> *)&local_c8);
                    }
                  }
                }
                local_e8[lVar14] = ut;
                uVar3 = uVar3 + 1;
              } while ((iVar5 < (int)local_f8) &&
                      (lVar7 = local_38 + lVar14, lVar14 = lVar14 + 1, lVar7 < (long)local_d0));
            }
            ppUVar12 = local_100;
            lVar14 = this->fActiveLimit;
            if (local_130 == lVar14) {
              uVar13 = uVar3 + 1;
              if ((int)uVar13 < (int)local_e0) {
                pUVar9 = local_100[(int)uVar13];
                uVar3 = uVar13;
                if (pUVar9 == (UText *)0x0) {
                  pUVar9 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
                  ppUVar12[(int)uVar13] = pUVar9;
                }
                else {
                  iVar6 = utext_nativeLength_63(pUVar9);
                  utext_replace_63(pUVar9,0,iVar6,L"",0,status);
                }
              }
              goto LAB_0016723a;
            }
            if (U_ZERO_ERROR < *status) goto LAB_0016723a;
            uVar3 = uVar3 + 1;
            dest = local_100;
          } while ((int)uVar3 < (int)uVar13);
        }
        uVar3 = uVar13;
        if (lVar14 - local_130 != 0 && local_130 <= lVar14) {
          if (((input->chunkNativeStart == 0) && (this->fInputLength == input->chunkNativeLimit)) &&
             (this->fInputLength == (long)input->nativeIndexingLimit)) {
            pUVar9 = dest[uVar13];
            if (pUVar9 == (UText *)0x0) {
              memset(&local_c8,0,0x90);
              local_c8.magic = 0x345ad82c;
              local_c8.sizeOfStruct = 0x90;
              utext_openUChars_63(&local_c8,input->chunkContents + local_130,lVar14 - local_130,
                                  status);
              pUVar9 = utext_clone_63((UText *)0x0,&local_c8,'\x01','\0',status);
              dest[uVar13] = pUVar9;
              utext_close_63(&local_c8);
            }
            else {
              iVar6 = utext_nativeLength_63(pUVar9);
              utext_replace_63(pUVar9,0,iVar6,input->chunkContents + local_130,
                               (int)this->fActiveLimit - (int)local_130,status);
            }
          }
          else {
            local_104 = U_ZERO_ERROR;
            iVar5 = utext_extract_63(input,local_130,lVar14,(UChar *)0x0,0,&local_104);
            pUVar8 = (UChar *)uprv_malloc_63((long)iVar5 * 2 + 2);
            if (pUVar8 == (UChar *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              utext_extract_63(input,local_130,this->fActiveLimit,pUVar8,iVar5 + 1,status);
              pUVar9 = dest[uVar13];
              if (pUVar9 == (UText *)0x0) {
                memset(&local_c8,0,0x90);
                local_c8.magic = 0x345ad82c;
                local_c8.sizeOfStruct = 0x90;
                utext_openUChars_63(&local_c8,pUVar8,(long)iVar5,status);
                pUVar9 = utext_clone_63((UText *)0x0,&local_c8,'\x01','\0',status);
                dest[uVar13] = pUVar9;
                utext_close_63(&local_c8);
              }
              else {
                iVar6 = utext_nativeLength_63(pUVar9);
                utext_replace_63(pUVar9,0,iVar6,pUVar8,iVar5,status);
              }
              uprv_free_63(pUVar8);
            }
          }
        }
LAB_0016723a:
        iVar5 = uVar3 + 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int32_t  RegexMatcher::split(UText *input,
        UText           *dest[],
        int32_t          destCapacity,
        UErrorCode      &status)
{
    //
    // Check arguements for validity
    //
    if (U_FAILURE(status)) {
        return 0;
    };

    if (destCapacity < 1) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    //
    // Reset for the input text
    //
    reset(input);
    int64_t   nextOutputStringStart = 0;
    if (fActiveLimit == 0) {
        return 0;
    }

    //
    // Loop through the input text, searching for the delimiter pattern
    //
    int32_t i;
    int32_t numCaptureGroups = fPattern->fGroupMap->size();
    for (i=0; ; i++) {
        if (i>=destCapacity-1) {
            // There is one or zero output string left.
            // Fill the last output string with whatever is left from the input, then exit the loop.
            //  ( i will be == destCapacity if we filled the output array while processing
            //    capture groups of the delimiter expression, in which case we will discard the
            //    last capture group saved in favor of the unprocessed remainder of the
            //    input string.)
            i = destCapacity-1;
            if (fActiveLimit > nextOutputStringStart) {
                if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                      input->chunkContents+nextOutputStringStart,
                                      (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                         fActiveLimit-nextOutputStringStart, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }
                } else {
                    UErrorCode lengthStatus = U_ZERO_ERROR;
                    int32_t remaining16Length =
                        utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                    UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                    if (remainingChars == NULL) {
                        status = U_MEMORY_ALLOCATION_ERROR;
                        break;
                    }

                    utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                    if (dest[i]) {
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                    } else {
                        UText remainingText = UTEXT_INITIALIZER;
                        utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                        dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                        utext_close(&remainingText);
                    }

                    uprv_free(remainingChars);
                }
            }
            break;
        }
        if (find()) {
            // We found another delimiter.  Move everything from where we started looking
            //  up until the start of the delimiter into the next output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fMatchStart-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                      fMatchStart-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fMatchStart, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                utext_extract(input, nextOutputStringStart, fMatchStart, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            nextOutputStringStart = fMatchEnd;

            // If the delimiter pattern has capturing parentheses, the captured
            //  text goes out into the next n destination strings.
            int32_t groupNum;
            for (groupNum=1; groupNum<=numCaptureGroups; groupNum++) {
                if (i >= destCapacity-2) {
                    // Never fill the last available output string with capture group text.
                    // It will filled with the last field, the remainder of the
                    //  unsplit input text.
                    break;
                }
                i++;
                dest[i] = utext_extract_replace(fInputText, dest[i],
                                               start64(groupNum, status), end64(groupNum, status), &status);
            }

            if (nextOutputStringStart == fActiveLimit) {
                // The delimiter was at the end of the string.  We're done, but first
                // we output one last empty string, for the empty field following
                //   the delimiter at the end of input.
                if (i+1 < destCapacity) {
                    ++i;
                    if (dest[i] == NULL) {
                        dest[i] = utext_openUChars(NULL, NULL, 0, &status);
                    } else {
                        static const UChar emptyString[] = {(UChar)0};
                        utext_replace(dest[i], 0, utext_nativeLength(dest[i]), emptyString, 0, &status);
                    }
                }
                break;

            }
        }
        else
        {
            // We ran off the end of the input while looking for the next delimiter.
            // All the remaining text goes into the current output string.
            if (UTEXT_FULL_TEXT_IN_CHUNK(input, fInputLength)) {
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]),
                                  input->chunkContents+nextOutputStringStart,
                                  (int32_t)(fActiveLimit-nextOutputStringStart), &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, input->chunkContents+nextOutputStringStart,
                                     fActiveLimit-nextOutputStringStart, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }
            } else {
                UErrorCode lengthStatus = U_ZERO_ERROR;
                int32_t remaining16Length = utext_extract(input, nextOutputStringStart, fActiveLimit, NULL, 0, &lengthStatus);
                UChar *remainingChars = (UChar *)uprv_malloc(sizeof(UChar)*(remaining16Length+1));
                if (remainingChars == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }

                utext_extract(input, nextOutputStringStart, fActiveLimit, remainingChars, remaining16Length+1, &status);
                if (dest[i]) {
                    utext_replace(dest[i], 0, utext_nativeLength(dest[i]), remainingChars, remaining16Length, &status);
                } else {
                    UText remainingText = UTEXT_INITIALIZER;
                    utext_openUChars(&remainingText, remainingChars, remaining16Length, &status);
                    dest[i] = utext_clone(NULL, &remainingText, TRUE, FALSE, &status);
                    utext_close(&remainingText);
                }

                uprv_free(remainingChars);
            }
            break;
        }
        if (U_FAILURE(status)) {
            break;
        }
    }   // end of for loop
    return i+1;
}